

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O2

void __thiscall XMLElement::XMLElement(XMLElement *this,XMLElement *old)

{
  std::__cxx11::string::string((string *)this,(string *)old);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->m_attributes)._M_t,&(old->m_attributes)._M_t);
  XMLElementBody::XMLElementBody(&this->m_body,&old->m_body);
  return;
}

Assistant:

XMLElement(const XMLElement& old)
        : m_name(old.m_name), m_attributes(old.m_attributes), m_body(old.m_body)
    {
    }